

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.h
# Opt level: O0

string * __thiscall
google::protobuf::compiler::js::GeneratorOptions::GetFileNameExtension_abi_cxx11_
          (string *__return_storage_ptr__,GeneratorOptions *this)

{
  allocator local_19;
  GeneratorOptions *local_18;
  GeneratorOptions *this_local;
  
  local_18 = this;
  this_local = (GeneratorOptions *)__return_storage_ptr__;
  if (this->import_style == kImportClosure) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->extension);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"_pb.js",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

string GetFileNameExtension() const {
    return import_style == kImportClosure ? extension : "_pb.js";
  }